

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::writeM<(moira::MemSpace)2,(moira::Size)4,0ul>(Moira *this,u32 addr,u32 val)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  
  writeM<(moira::MemSpace)2,(moira::Size)2,0ul>
            ((Moira *)CONCAT44(in_ESI,in_EDX),(u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
  writeM<(moira::MemSpace)2,(moira::Size)2,0ul>
            ((Moira *)CONCAT44(in_ESI,in_EDX),(u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
  return;
}

Assistant:

void
Moira::writeM(u32 addr, u32 val)
{
    // Break down long word accesses into two word accesses
    if (S == Long) {
        if (F & REVERSE) {
            writeM <M, Word>    (addr + 2, val & 0xFFFF);
            writeM <M, Word, F> (addr,     val >> 16   );
        } else {
            writeM <M, Word>    (addr,     val >> 16   );
            writeM <M, Word, F> (addr + 2, val & 0xFFFF);
        }
        return;
    }
    
    // Update function code pins
    setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);
    
    // Check if a watchpoint is being accessed
    if ((flags & CPU_CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        watchpointReached(addr);
    }

    // Perform the write operation
    sync(2);
    if (F & POLLIPL) pollIrq();
    S == Byte ? write8(addr & 0xFFFFFF, (u8)val) : write16(addr & 0xFFFFFF, (u16)val);
    sync(2);
}